

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sin(NeuralNetworkLayer *this)

{
  SinLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x2c6) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2c6;
    this_00 = (SinLayerParams *)operator_new(0x18);
    SinLayerParams::SinLayerParams(this_00);
    (this->layer_).sin_ = this_00;
  }
  return (SinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SinLayerParams* NeuralNetworkLayer::mutable_sin() {
  if (!has_sin()) {
    clear_layer();
    set_has_sin();
    layer_.sin_ = new ::CoreML::Specification::SinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sin)
  return layer_.sin_;
}